

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

AsmJsModuleInfo * __thiscall Js::FunctionBody::AllocateAsmJsModuleInfo(FunctionBody *this)

{
  Recycler *this_00;
  code *pcVar1;
  bool bVar2;
  void *pvVar3;
  undefined4 *puVar4;
  Recycler *alloc;
  undefined8 *ptr;
  AsmJsModuleInfo *pAVar5;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  pvVar3 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,AsmJsModuleInfo);
  if (pvVar3 != (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1996,"(!this->GetAsmJsModuleInfo())",
                                "!this->GetAsmJsModuleInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  local_48 = (undefined1  [8])&AsmJsModuleInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab02c8;
  data.filename._0_4_ = 0x1998;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_48);
  ptr = (undefined8 *)new<Memory::Recycler>(0xb0,alloc,0x387914);
  *ptr = this_00;
  ptr[1] = 0;
  ptr[2] = 0;
  ptr[3] = 0;
  ptr[5] = 0;
  ptr[6] = 0;
  ptr[8] = 0;
  ptr[9] = 0;
  ptr[10] = 0;
  ptr[0xb] = 0;
  ptr[0xc] = 0;
  ptr[0x12] = 0;
  ptr[0x13] = 0;
  *(undefined8 *)((long)ptr + 0x9d) = 0;
  *(undefined8 *)((long)ptr + 0xa5) = 0;
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,AsmJsModuleInfo,ptr);
  pAVar5 = (AsmJsModuleInfo *)FunctionProxy::GetAuxPtr((FunctionProxy *)this,AsmJsModuleInfo);
  return pAVar5;
}

Assistant:

AsmJsModuleInfo* FunctionBody::AllocateAsmJsModuleInfo()
    {
        Assert( !this->GetAsmJsModuleInfo() );
        Recycler* rec = m_scriptContext->GetRecycler();
        this->SetAuxPtr<AuxPointerType::AsmJsModuleInfo>(RecyclerNew(rec, AsmJsModuleInfo, rec));
        return this->GetAsmJsModuleInfo();
    }